

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O3

void print2Dfield(double **field,int sizeX,int sizeY)

{
  ulong uVar1;
  ulong uVar2;
  
  if (field != (double **)0x0) {
    if (0 < sizeY) {
      uVar2 = 0;
      do {
        if (0 < sizeX) {
          uVar1 = 0;
          do {
            printf("%5g\t",field[uVar1][uVar2]);
            uVar1 = uVar1 + 1;
          } while ((uint)sizeX != uVar1);
        }
        putchar(10);
        uVar2 = uVar2 + 1;
      } while (uVar2 != (uint)sizeY);
    }
    putchar(10);
    return;
  }
  puts("The field is invalid. Please check your input!");
  return;
}

Assistant:

void print2Dfield (REAL** field, int sizeX, int sizeY)
{
	if (field == NULL)
	{
		printf("The field is invalid. Please check your input!\n");
		return;
	}
	for (int j = 0; j < sizeY; j++)
	{
		for (int i = 0; i < sizeX; i++)
		{
			printf("%5g\t",field[i][j]);
		}
		printf("\n");
	}
	printf("\n"); /* Add another empty line for better readability in the output */
	return;
}